

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  ulong *puVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBP;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  long local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  long local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  long local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_54;
  string local_50;
  
  do {
    iVar2 = close(*(int *)((long)child_arg + 8));
    if (iVar2 != -1) {
      UnitTest::GetInstance();
      iVar2 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar2 != 0) {
        paVar11 = &local_c8;
        local_d8 = paVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"chdir(\"","");
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
        paVar12 = &local_a8;
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar4;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar4 + 2);
        if (local_b8 == paVar9) {
          local_a8._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_a8._8_8_ = plVar4[3];
          local_b8 = paVar12;
        }
        else {
          local_a8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_b0 = plVar4[1];
        *plVar4 = (long)paVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
        paVar9 = &local_128;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar5;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if (local_138 == paVar10) {
          local_128._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_128._8_8_ = puVar5[3];
          local_138 = paVar9;
        }
        else {
          local_128._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_130 = puVar5[1];
        *puVar5 = paVar10;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar8 = 0xf;
        if (local_138 != paVar9) {
          uVar8 = local_128._M_allocated_capacity;
        }
        paVar10 = &local_e8;
        if ((ulong)uVar8 < (ulong)(local_f0 + local_130)) {
          uVar8 = 0xf;
          if (local_f8 != paVar10) {
            uVar8 = local_e8._M_allocated_capacity;
          }
          if ((ulong)uVar8 < (ulong)(local_f0 + local_130)) goto LAB_002b7764;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_138);
        }
        else {
LAB_002b7764:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8)
          ;
        }
        local_118._M_dataplus._M_p = (pointer)*puVar5;
        psVar7 = puVar5 + 2;
        if ((size_type *)local_118._M_dataplus._M_p == psVar7) {
          local_118.field_2._M_allocated_capacity = *psVar7;
          local_118.field_2._8_8_ = puVar5[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar7;
        }
        local_118._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)psVar7 = 0;
        DeathTestAbort(&local_118);
        puVar5 = extraout_RAX;
        local_b8 = extraout_RDX;
        goto LAB_002b7967;
      }
      execv(**child_arg,*child_arg);
      paVar12 = &local_68;
      local_78 = paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"execv(","");
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
      paVar11 = &local_e8;
      local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar5;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if (local_f8 == paVar9) {
        local_e8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_e8._8_8_ = puVar5[3];
        local_f8 = paVar11;
      }
      else {
        local_e8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_f0 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      paVar9 = &local_c8;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar5;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar5 + 2);
      if (local_d8 == paVar10) {
        local_c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_c8._8_8_ = puVar5[3];
        local_d8 = paVar9;
      }
      else {
        local_c8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_d0 = puVar5[1];
      *puVar5 = paVar10;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      paVar10 = &local_a8;
      local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar5;
      psVar7 = puVar5 + 2;
      if (local_b8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_a8._M_allocated_capacity = *psVar7;
        local_a8._8_8_ = puVar5[3];
        local_b8 = paVar10;
      }
      else {
        local_a8._M_allocated_capacity = *psVar7;
      }
      local_b0 = puVar5[1];
      *puVar5 = psVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
      unaff_RBP = &local_128;
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5;
      puVar6 = puVar5 + 2;
      if (local_138 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_128._M_allocated_capacity = *puVar6;
        local_128._8_8_ = puVar5[3];
        local_138 = unaff_RBP;
      }
      else {
        local_128._M_allocated_capacity = *puVar6;
      }
      local_130 = puVar5[1];
      *puVar5 = puVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      GetLastErrnoDescription_abi_cxx11_();
      uVar8 = 0xf;
      if (local_138 != unaff_RBP) {
        uVar8 = local_128._M_allocated_capacity;
      }
      if ((ulong)uVar8 < (ulong)(local_90 + local_130)) {
        uVar8 = 0xf;
        if (local_98 != &local_88) {
          uVar8 = local_88._M_allocated_capacity;
        }
        if ((ulong)uVar8 < (ulong)(local_90 + local_130)) goto LAB_002b7926;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_002b7926:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_98);
      }
      local_118._M_dataplus._M_p = (pointer)*puVar5;
      psVar7 = puVar5 + 2;
      if ((size_type *)local_118._M_dataplus._M_p == psVar7) {
        local_118.field_2._M_allocated_capacity = *psVar7;
        local_118.field_2._8_8_ = puVar5[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar7;
      }
      local_118._M_string_length = puVar5[1];
      *puVar5 = psVar7;
      puVar5[1] = 0;
      *(undefined1 *)psVar7 = 0;
      DeathTestAbort(&local_118);
      puVar5 = extraout_RAX_00;
      local_118._M_dataplus._M_p = (pointer)extraout_RDX_00;
      goto LAB_002b7a79;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  paVar11 = &local_88;
  local_98 = paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar12 = &local_68;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar4;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if (local_78 == paVar9) {
    local_68._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_68._8_8_ = plVar4[3];
    local_78 = paVar12;
  }
  else {
    local_68._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)paVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
  paVar9 = &local_e8;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if (local_f8 == paVar10) {
    local_e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_e8._8_8_ = puVar5[3];
    local_f8 = paVar9;
  }
  else {
    local_e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_f0 = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_54 = 0x4d5;
  StreamableToString<int>(&local_50,&local_54);
  uVar8 = 0xf;
  if (local_f8 != paVar9) {
    uVar8 = local_e8._M_allocated_capacity;
  }
  paVar10 = &local_50.field_2;
  if ((ulong)uVar8 < local_50._M_string_length + local_f0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar10) {
      uVar8 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_f0 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_f8);
      goto LAB_002b77e8;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_50._M_dataplus._M_p);
LAB_002b77e8:
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar5;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if (local_d8 == paVar1) {
    local_c8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_c8._8_8_ = puVar5[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_d0 = puVar5[1];
  *puVar5 = paVar1;
  puVar5[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
  unaff_RBP = &local_a8;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar5;
  psVar7 = puVar5 + 2;
  if (local_b8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_a8._M_allocated_capacity = *psVar7;
    local_a8._8_8_ = puVar5[3];
    local_b8 = unaff_RBP;
  }
  else {
LAB_002b7967:
    local_a8._M_allocated_capacity = *psVar7;
  }
  local_b0 = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5;
  puVar6 = puVar5 + 2;
  if (local_138 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_128._M_allocated_capacity = *puVar6;
    local_128._8_8_ = puVar5[3];
    local_138 = &local_128;
  }
  else {
    local_128._M_allocated_capacity = *puVar6;
  }
  local_130 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
  local_118._M_dataplus._M_p = (pointer)*puVar5;
  psVar7 = puVar5 + 2;
  if ((size_type *)local_118._M_dataplus._M_p == psVar7) {
    local_118.field_2._M_allocated_capacity = *psVar7;
    local_118.field_2._8_8_ = puVar5[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
LAB_002b7a79:
    local_118.field_2._M_allocated_capacity = *psVar7;
  }
  local_118._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_b8 != unaff_RBP) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar10) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_f8 != paVar9) {
    operator_delete(local_f8);
  }
  if (local_78 != paVar12) {
    operator_delete(local_78);
  }
  if (local_98 != paVar11) {
    operator_delete(local_98);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}